

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Promise<void> __thiscall
kj::anon_unknown_36::WebSocketPipeImpl::pumpTo(WebSocketPipeImpl *this,WebSocket *other)

{
  PromiseArena *pPVar1;
  OwnPromiseNode OVar2;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> node;
  undefined1 auVar3 [8];
  Disposer DVar4;
  void *pvVar5;
  long *in_RDX;
  TransformPromiseNodeBase *this_00;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:3918:45),_void>
  onAbort;
  OwnPromiseNode intermediate;
  OwnPromiseNode local_68;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_60;
  undefined1 local_58 [8];
  Disposer local_50;
  undefined1 local_48 [16];
  Maybe<kj::WebSocket_&> local_38;
  
  (**(code **)(*in_RDX + 0x28))(&local_68);
  OVar2.ptr = local_68.ptr;
  pPVar1 = ((local_68.ptr)->super_PromiseArenaMember).arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_68.ptr - (long)pPVar1) < 0x28) {
    pvVar5 = operator_new(0x400);
    this_00 = (TransformPromiseNodeBase *)((long)pvVar5 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_68,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:3918:45)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar5 + 0x3d8) = &PTR_destroy_0063f750;
    *(void **)((long)pvVar5 + 0x3e0) = pvVar5;
  }
  else {
    ((local_68.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    this_00 = (TransformPromiseNodeBase *)&local_68.ptr[-3].super_PromiseArenaMember.arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_68,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:3918:45)>
               ::anon_class_1_0_00000001_for_func::operator());
    OVar2.ptr[-3].super_PromiseArenaMember.arena = (PromiseArena *)&PTR_destroy_0063f750;
    OVar2.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  local_48._0_8_ = &DAT_004a8171;
  local_48._8_8_ = &DAT_004a81d0;
  local_38.ptr = (WebSocket *)&DAT_4c0000058b;
  local_58 = (undefined1  [8])this_00;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)&local_50,(OwnPromiseNode *)local_58,(SourceLocation *)local_48);
  auVar3 = local_58;
  local_60.ptr = (PromiseNode *)local_50._vptr_Disposer;
  if (local_58 != (undefined1  [8])0x0) {
    local_58 = (undefined1  [8])0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)auVar3);
  }
  OVar2.ptr = local_68.ptr;
  if (&(local_68.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_68.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
  }
  pumpToNoAbort((WebSocketPipeImpl *)local_58,other);
  local_48._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  local_48._8_8_ = "pumpTo";
  local_38.ptr = (WebSocket *)0xc00000f52;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ExclusiveJoinPromiseNode,kj::_::PromiseDisposer,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::SourceLocation&>
            ((PromiseDisposer *)&local_50,(OwnPromiseNode *)local_58,&local_60,
             (SourceLocation *)local_48);
  DVar4._vptr_Disposer = local_50._vptr_Disposer;
  auVar3 = local_58;
  local_50._vptr_Disposer = (_func_int **)0x0;
  (this->super_WebSocket)._vptr_WebSocket = DVar4._vptr_Disposer;
  if (local_58 != (undefined1  [8])0x0) {
    local_58 = (undefined1  [8])0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)auVar3);
  }
  node.ptr = local_60.ptr;
  if (&(local_60.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_60.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(node.ptr)->super_PromiseArenaMember);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> pumpTo(WebSocket& other) override {
    auto onAbort = other.whenAborted().then([]() -> kj::Promise<void> {
      return KJ_EXCEPTION(DISCONNECTED, "WebSocket was aborted");
    });

    return pumpToNoAbort(other).exclusiveJoin(kj::mv(onAbort));
  }